

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetRepeatedEnum
          (ExtensionSet *this,int number,int index,int value)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  pointer ppVar4;
  LogFinisher local_fa;
  byte local_f9;
  LogMessage local_f8;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  _Self local_30;
  _Self local_28;
  iterator iter;
  int value_local;
  int index_local;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node._4_4_ = value;
  value_local = number;
  _index_local = this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,&value_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar1 = std::operator!=(&local_28,&local_30);
  local_69 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x1c9);
    local_69 = 1;
    pLVar3 = LogMessage::operator<<(&local_68,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(local_7d,pLVar3);
  }
  if ((local_69 & 1) != 0) {
    LogMessage::~LogMessage(&local_68);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_28);
  local_b9 = 0;
  if (((ppVar4->second).is_repeated & 1U) == 0) {
    LogMessage::LogMessage
              (&local_b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x1ca);
    local_b9 = 1;
    pLVar3 = LogMessage::operator<<
                       (&local_b8,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=(&local_ba,pLVar3);
  }
  if ((local_b9 & 1) != 0) {
    LogMessage::~LogMessage(&local_b8);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_28);
  CVar2 = anon_unknown_29::cpp_type((ppVar4->second).type);
  local_f9 = 0;
  if (CVar2 != CPPTYPE_ENUM) {
    LogMessage::LogMessage
              (&local_f8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x1ca);
    local_f9 = 1;
    pLVar3 = LogMessage::operator<<
                       (&local_f8,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                       );
    LogFinisher::operator=(&local_fa,pLVar3);
  }
  if ((local_f9 & 1) != 0) {
    LogMessage::~LogMessage(&local_f8);
  }
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_28);
  RepeatedField<int>::Set
            ((ppVar4->second).field_0.repeated_int32_value,index,(int *)((long)&iter._M_node + 4));
  return;
}

Assistant:

void ExtensionSet::SetRepeatedEnum(int number, int index, int value) {
  ExtensionMap::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, ENUM);
  iter->second.repeated_enum_value->Set(index, value);
}